

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status
hrgls_DataBlobSourceCreateParametersSetName(hrgls_DataBlobSourceCreateParams params,char *name)

{
  if (params != (hrgls_DataBlobSourceCreateParams)0x0) {
    std::__cxx11::string::assign((char *)&params->name);
    return 0;
  }
  return 0x3ee;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceCreateParametersSetName(
    hrgls_DataBlobSourceCreateParams params, const char *name)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!name) {
      params->name = "";
    } else {
      params->name = name;
    }
    return s;
  }